

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonProceduralExprVisitor.h
# Opt level: O1

void __thiscall
slang::analysis::NonProceduralExprVisitor::visit<slang::ast::CallExpression>
          (NonProceduralExprVisitor *this,CallExpression *expr)

{
  bool bVar1;
  TimingControl *pTVar2;
  
  bVar1 = ClockInference::isSampledValueFuncCall(&expr->super_Expression);
  if (bVar1) {
    pTVar2 = getDefaultClocking(this);
    if (pTVar2 == (TimingControl *)0x0) {
      ClockInference::checkSampledValueFuncs
                (this->context,this->containingSymbol,&expr->super_Expression);
    }
  }
  ast::CallExpression::visitExprs<slang::analysis::NonProceduralExprVisitor&>(expr,(Result *)this);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_same_v<T, CallExpression>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                // If we don't have a default clocking active in this scope then
                // we should check the call to be sure it has an explicit clock provided.
                if (getDefaultClocking() == nullptr)
                    ClockInference::checkSampledValueFuncs(context, containingSymbol, expr);
            }
        }
        else if constexpr (std::is_same_v<T, AssertionInstanceExpression>) {
            // We might want to find a place to store these analyzed assertions created in
            // non-procedural contexts, but for now it's enough to make sure they're valid.
            AnalyzedAssertion(context, getDefaultClocking(), nullptr, containingSymbol, expr);
        }

        if constexpr (HasVisitExprs<T, NonProceduralExprVisitor>) {
            expr.visitExprs(*this);
        }
    }